

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

void parasail_profile_free(parasail_profile_t *profile)

{
  parasail_profile_t *profile_local;
  
  if (profile == (parasail_profile_t *)0x0) {
    fprintf(_stderr,"%s: attempted free of NULL profile pointer\n","parasail_profile_free");
  }
  else {
    if ((profile->profile8).score != (void *)0x0) {
      (*profile->free)((profile->profile8).score);
    }
    if ((profile->profile8).matches != (void *)0x0) {
      (*profile->free)((profile->profile8).matches);
    }
    if ((profile->profile8).similar != (void *)0x0) {
      (*profile->free)((profile->profile8).similar);
    }
    if ((profile->profile16).score != (void *)0x0) {
      (*profile->free)((profile->profile16).score);
    }
    if ((profile->profile16).matches != (void *)0x0) {
      (*profile->free)((profile->profile16).matches);
    }
    if ((profile->profile16).similar != (void *)0x0) {
      (*profile->free)((profile->profile16).similar);
    }
    if ((profile->profile32).score != (void *)0x0) {
      (*profile->free)((profile->profile32).score);
    }
    if ((profile->profile32).matches != (void *)0x0) {
      (*profile->free)((profile->profile32).matches);
    }
    if ((profile->profile32).similar != (void *)0x0) {
      (*profile->free)((profile->profile32).similar);
    }
    if ((profile->profile64).score != (void *)0x0) {
      (*profile->free)((profile->profile64).score);
    }
    if ((profile->profile64).matches != (void *)0x0) {
      (*profile->free)((profile->profile64).matches);
    }
    if ((profile->profile64).similar != (void *)0x0) {
      (*profile->free)((profile->profile64).similar);
    }
    free(profile);
  }
  return;
}

Assistant:

void parasail_profile_free(parasail_profile_t *profile)
{
    if (!profile) {
        fprintf(stderr, "%s: attempted free of NULL profile pointer\n", __func__);
        return;
    }

    if (NULL != profile->profile8.score) {
        profile->free(profile->profile8.score);
    }
    if (NULL != profile->profile8.matches) {
        profile->free(profile->profile8.matches);
    }
    if (NULL != profile->profile8.similar) {
        profile->free(profile->profile8.similar);
    }

    if (NULL != profile->profile16.score) {
        profile->free(profile->profile16.score);
    }
    if (NULL != profile->profile16.matches) {
        profile->free(profile->profile16.matches);
    }
    if (NULL != profile->profile16.similar) {
        profile->free(profile->profile16.similar);
    }

    if (NULL != profile->profile32.score) {
        profile->free(profile->profile32.score);
    }
    if (NULL != profile->profile32.matches) {
        profile->free(profile->profile32.matches);
    }
    if (NULL != profile->profile32.similar) {
        profile->free(profile->profile32.similar);
    }

    if (NULL != profile->profile64.score) {
        profile->free(profile->profile64.score);
    }
    if (NULL != profile->profile64.matches) {
        profile->free(profile->profile64.matches);
    }
    if (NULL != profile->profile64.similar) {
        profile->free(profile->profile64.similar);
    }

    free(profile);
}